

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

double __thiscall mp::internal::TextReader<fmt::Locale>::ReadDouble(TextReader<fmt::Locale> *this)

{
  long lVar1;
  char **__endptr;
  long *in_RDI;
  TextReader<fmt::Locale> *in_stack_00000008;
  double value;
  char *start;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  double local_18;
  
  SkipSpace((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe0.data_);
  lVar1 = *in_RDI;
  local_18 = 0.0;
  if (*(char *)*in_RDI != '\n') {
    local_18 = fmt::Locale::strtod((Locale *)(in_RDI + 10),(char *)in_RDI,__endptr);
  }
  if (*in_RDI == lVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"expected double");
    ReportError<>(in_stack_00000008,(CStringRef)value);
  }
  return local_18;
}

Assistant:

double ReadDouble() {
    SkipSpace();
    const char *start = ptr_;
    double value = 0;
    if (*ptr_ != '\n')
      value = locale_.strtod(ptr_);
    if (ptr_ == start)
      ReportError("expected double");
    return value;
  }